

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O3

void secp256k1_sha256_write(secp256k1_sha256 *hash,uchar *data,size_t len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  size_t __n;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  ulong local_b0;
  
  uVar31 = (ulong)((uint)hash->bytes & 0x3f);
  hash->bytes = hash->bytes + len;
  __n = 0x40 - uVar31;
  local_b0 = uVar31;
  if (__n <= len) {
    local_b0 = 0;
    do {
      memcpy((void *)((long)hash->buf + uVar31),data,__n);
      data = data + __n;
      len = len - __n;
      uVar1 = hash->s[0];
      uVar2 = hash->s[1];
      uVar3 = hash->s[2];
      uVar4 = hash->s[3];
      uVar5 = hash->s[4];
      uVar6 = hash->s[5];
      uVar7 = hash->s[6];
      uVar8 = hash->s[7];
      uVar12 = hash->buf[0];
      uVar21 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
      iVar10 = ((uVar7 ^ uVar6) & uVar5 ^ uVar7) + uVar8 +
               ((uVar5 << 7 | uVar5 >> 0x19) ^
               (uVar5 << 0x15 | uVar5 >> 0xb) ^ (uVar5 << 0x1a | uVar5 >> 6));
      uVar13 = iVar10 + uVar21 + uVar4 + 0x428a2f98;
      uVar11 = ((uVar2 | uVar1) & uVar3 | uVar2 & uVar1) +
               ((uVar1 << 10 | uVar1 >> 0x16) ^
               (uVar1 << 0x13 | uVar1 >> 0xd) ^ (uVar1 << 0x1e | uVar1 >> 2)) +
               uVar21 + iVar10 + 0x428a2f98;
      uVar12 = hash->buf[1];
      uVar38 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8;
      uVar28 = uVar38 | uVar12 << 0x18;
      uVar15 = (uVar13 * 0x80 | uVar13 >> 0x19) ^
               (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6);
      iVar10 = ((uVar6 ^ uVar5) & uVar13 ^ uVar6) + uVar7 + uVar28;
      uVar16 = ((uVar11 | uVar1) & uVar2 | uVar11 & uVar1) +
               ((uVar11 * 0x400 | uVar11 >> 0x16) ^
               (uVar11 * 0x80000 | uVar11 >> 0xd) ^ (uVar11 * 0x40000000 | uVar11 >> 2)) +
               iVar10 + uVar15 + 0x71374491;
      uVar22 = uVar3 + iVar10 + uVar15 + 0x71374491;
      uVar15 = hash->buf[2];
      uVar39 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8;
      uVar32 = uVar39 | uVar15 << 0x18;
      iVar10 = ((uVar13 ^ uVar5) & uVar22 ^ uVar5) + uVar32 + uVar6;
      uVar33 = (uVar22 * 0x80 | uVar22 >> 0x19) ^
               (uVar22 * 0x200000 | uVar22 >> 0xb) ^ (uVar22 * 0x4000000 | uVar22 >> 6);
      uVar42 = iVar10 + uVar33 + uVar2 + 0xb5c0fbcf;
      uVar29 = ((uVar16 | uVar11) & uVar1 | uVar16 & uVar11) +
               ((uVar16 * 0x400 | uVar16 >> 0x16) ^
               (uVar16 * 0x80000 | uVar16 >> 0xd) ^ (uVar16 * 0x40000000 | uVar16 >> 2)) +
               uVar33 + iVar10 + -0x4a3f0431;
      uVar33 = hash->buf[3];
      uVar41 = uVar33 >> 0x18 | (uVar33 & 0xff0000) >> 8 | (uVar33 & 0xff00) << 8;
      uVar47 = uVar41 | uVar33 << 0x18;
      iVar10 = ((uVar22 ^ uVar13) & uVar42 ^ uVar13) + uVar47 + uVar5;
      uVar48 = (uVar42 * 0x80 | uVar42 >> 0x19) ^
               (uVar42 * 0x200000 | uVar42 >> 0xb) ^ (uVar42 * 0x4000000 | uVar42 >> 6);
      uVar17 = iVar10 + uVar48 + uVar1 + 0xe9b5dba5;
      uVar34 = ((uVar29 | uVar16) & uVar11 | uVar29 & uVar16) +
               ((uVar29 * 0x400 | uVar29 >> 0x16) ^
               (uVar29 * 0x80000 | uVar29 >> 0xd) ^ (uVar29 * 0x40000000 | uVar29 >> 2)) +
               iVar10 + uVar48 + -0x164a245b;
      uVar48 = hash->buf[4];
      uVar50 = uVar48 >> 0x18 | (uVar48 & 0xff0000) >> 8 | (uVar48 & 0xff00) << 8;
      uVar18 = uVar50 | uVar48 << 0x18;
      iVar10 = uVar13 + uVar18 + ((uVar42 ^ uVar22) & uVar17 ^ uVar22) +
               ((uVar17 * 0x80 | uVar17 >> 0x19) ^
               (uVar17 * 0x200000 | uVar17 >> 0xb) ^ (uVar17 * 0x4000000 | uVar17 >> 6)) +
               0x3956c25b;
      uVar11 = uVar11 + iVar10;
      uVar40 = ((uVar34 | uVar29) & uVar16 | uVar34 & uVar29) +
               ((uVar34 * 0x400 | uVar34 >> 0x16) ^
               (uVar34 * 0x80000 | uVar34 >> 0xd) ^ (uVar34 * 0x40000000 | uVar34 >> 2)) + iVar10;
      uVar13 = hash->buf[5];
      uVar52 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8;
      uVar19 = uVar52 | uVar13 << 0x18;
      iVar10 = ((uVar11 * 0x80 | uVar11 >> 0x19) ^
               (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6)) +
               uVar22 + uVar19 + ((uVar17 ^ uVar42) & uVar11 ^ uVar42) + 0x59f111f1;
      uVar16 = uVar16 + iVar10;
      uVar49 = ((uVar40 | uVar34) & uVar29 | uVar40 & uVar34) +
               ((uVar40 * 0x400 | uVar40 >> 0x16) ^
               (uVar40 * 0x80000 | uVar40 >> 0xd) ^ (uVar40 * 0x40000000 | uVar40 >> 2)) + iVar10;
      uVar22 = hash->buf[6];
      uVar53 = uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8;
      uVar20 = uVar53 | uVar22 << 0x18;
      iVar10 = ((uVar16 * 0x80 | uVar16 >> 0x19) ^
               (uVar16 * 0x200000 | uVar16 >> 0xb) ^ (uVar16 * 0x4000000 | uVar16 >> 6)) +
               uVar42 + uVar20 + ((uVar11 ^ uVar17) & uVar16 ^ uVar17) + -0x6dc07d5c;
      uVar29 = uVar29 + iVar10;
      uVar61 = ((uVar49 | uVar40) & uVar34 | uVar49 & uVar40) +
               ((uVar49 * 0x400 | uVar49 >> 0x16) ^
               (uVar49 * 0x80000 | uVar49 >> 0xd) ^ (uVar49 * 0x40000000 | uVar49 >> 2)) + iVar10;
      uVar42 = hash->buf[7];
      uVar54 = uVar42 >> 0x18 | (uVar42 & 0xff0000) >> 8 | (uVar42 & 0xff00) << 8;
      uVar43 = uVar54 | uVar42 << 0x18;
      iVar10 = ((uVar29 * 0x80 | uVar29 >> 0x19) ^
               (uVar29 * 0x200000 | uVar29 >> 0xb) ^ (uVar29 * 0x4000000 | uVar29 >> 6)) +
               uVar17 + uVar43 + ((uVar16 ^ uVar11) & uVar29 ^ uVar11) + -0x54e3a12b;
      uVar34 = uVar34 + iVar10;
      uVar62 = ((uVar61 | uVar49) & uVar40 | uVar61 & uVar49) +
               ((uVar61 * 0x400 | uVar61 >> 0x16) ^
               (uVar61 * 0x80000 | uVar61 >> 0xd) ^ (uVar61 * 0x40000000 | uVar61 >> 2)) + iVar10;
      uVar17 = hash->buf[8];
      uVar63 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8;
      uVar44 = uVar63 | uVar17 << 0x18;
      iVar10 = uVar11 + uVar44 + ((uVar29 ^ uVar16) & uVar34 ^ uVar16) +
               ((uVar34 * 0x80 | uVar34 >> 0x19) ^
               (uVar34 * 0x200000 | uVar34 >> 0xb) ^ (uVar34 * 0x4000000 | uVar34 >> 6)) +
               -0x27f85568;
      uVar40 = uVar40 + iVar10;
      uVar14 = ((uVar62 | uVar61) & uVar49 | uVar62 & uVar61) +
               ((uVar62 * 0x400 | uVar62 >> 0x16) ^
               (uVar62 * 0x80000 | uVar62 >> 0xd) ^ (uVar62 * 0x40000000 | uVar62 >> 2)) + iVar10;
      uVar11 = hash->buf[9];
      uVar56 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8;
      uVar45 = uVar56 | uVar11 << 0x18;
      iVar10 = ((uVar40 * 0x80 | uVar40 >> 0x19) ^
               (uVar40 * 0x200000 | uVar40 >> 0xb) ^ (uVar40 * 0x4000000 | uVar40 >> 6)) +
               uVar16 + uVar45 + ((uVar34 ^ uVar29) & uVar40 ^ uVar29) + 0x12835b01;
      uVar49 = uVar49 + iVar10;
      uVar55 = ((uVar14 | uVar62) & uVar61 | uVar14 & uVar62) +
               ((uVar14 * 0x400 | uVar14 >> 0x16) ^
               (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar10;
      uVar16 = hash->buf[10];
      uVar57 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8;
      uVar23 = uVar57 | uVar16 << 0x18;
      iVar10 = ((uVar49 * 0x80 | uVar49 >> 0x19) ^
               (uVar49 * 0x200000 | uVar49 >> 0xb) ^ (uVar49 * 0x4000000 | uVar49 >> 6)) +
               uVar29 + uVar23 + ((uVar40 ^ uVar34) & uVar49 ^ uVar34) + 0x243185be;
      uVar61 = uVar61 + iVar10;
      uVar51 = ((uVar55 | uVar14) & uVar62 | uVar55 & uVar14) +
               ((uVar55 * 0x400 | uVar55 >> 0x16) ^
               (uVar55 * 0x80000 | uVar55 >> 0xd) ^ (uVar55 * 0x40000000 | uVar55 >> 2)) + iVar10;
      uVar29 = hash->buf[0xb];
      uVar58 = uVar29 >> 0x18 | (uVar29 & 0xff0000) >> 8 | (uVar29 & 0xff00) << 8;
      uVar24 = uVar58 | uVar29 << 0x18;
      iVar10 = ((uVar61 * 0x80 | uVar61 >> 0x19) ^
               (uVar61 * 0x200000 | uVar61 >> 0xb) ^ (uVar61 * 0x4000000 | uVar61 >> 6)) +
               uVar34 + uVar24 + ((uVar49 ^ uVar40) & uVar61 ^ uVar40) + 0x550c7dc3;
      uVar62 = uVar62 + iVar10;
      uVar46 = ((uVar51 | uVar55) & uVar14 | uVar51 & uVar55) +
               ((uVar51 * 0x400 | uVar51 >> 0x16) ^
               (uVar51 * 0x80000 | uVar51 >> 0xd) ^ (uVar51 * 0x40000000 | uVar51 >> 2)) + iVar10;
      uVar34 = hash->buf[0xc];
      uVar59 = uVar34 >> 0x18 | (uVar34 & 0xff0000) >> 8 | (uVar34 & 0xff00) << 8;
      uVar25 = uVar59 | uVar34 << 0x18;
      iVar10 = ((uVar62 * 0x80 | uVar62 >> 0x19) ^
               (uVar62 * 0x200000 | uVar62 >> 0xb) ^ (uVar62 * 0x4000000 | uVar62 >> 6)) +
               uVar40 + uVar25 + ((uVar61 ^ uVar49) & uVar62 ^ uVar49) + 0x72be5d74;
      uVar14 = uVar14 + iVar10;
      uVar35 = ((uVar46 | uVar51) & uVar55 | uVar46 & uVar51) +
               ((uVar46 * 0x400 | uVar46 >> 0x16) ^
               (uVar46 * 0x80000 | uVar46 >> 0xd) ^ (uVar46 * 0x40000000 | uVar46 >> 2)) + iVar10;
      uVar40 = hash->buf[0xd];
      uVar60 = uVar40 >> 0x18 | (uVar40 & 0xff0000) >> 8 | (uVar40 & 0xff00) << 8;
      uVar26 = uVar60 | uVar40 << 0x18;
      iVar10 = ((uVar14 * 0x80 | uVar14 >> 0x19) ^
               (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6)) +
               uVar49 + uVar26 + ((uVar62 ^ uVar61) & uVar14 ^ uVar61) + -0x7f214e02;
      uVar55 = uVar55 + iVar10;
      uVar36 = ((uVar35 | uVar46) & uVar51 | uVar35 & uVar46) +
               ((uVar35 * 0x400 | uVar35 >> 0x16) ^
               (uVar35 * 0x80000 | uVar35 >> 0xd) ^ (uVar35 * 0x40000000 | uVar35 >> 2)) + iVar10;
      uVar49 = hash->buf[0xe];
      uVar64 = uVar49 >> 0x18 | (uVar49 & 0xff0000) >> 8 | (uVar49 & 0xff00) << 8;
      uVar27 = uVar64 | uVar49 << 0x18;
      iVar10 = ((uVar55 * 0x80 | uVar55 >> 0x19) ^
               (uVar55 * 0x200000 | uVar55 >> 0xb) ^ (uVar55 * 0x4000000 | uVar55 >> 6)) +
               uVar61 + uVar27 + ((uVar14 ^ uVar62) & uVar55 ^ uVar62) + -0x6423f959;
      uVar51 = uVar51 + iVar10;
      uVar37 = ((uVar36 | uVar35) & uVar46 | uVar36 & uVar35) +
               ((uVar36 * 0x400 | uVar36 >> 0x16) ^
               (uVar36 * 0x80000 | uVar36 >> 0xd) ^ (uVar36 * 0x40000000 | uVar36 >> 2)) + iVar10;
      uVar61 = hash->buf[0xf];
      uVar9 = uVar61 >> 0x18 | (uVar61 & 0xff0000) >> 8 | (uVar61 & 0xff00) << 8;
      uVar30 = uVar9 | uVar61 << 0x18;
      iVar10 = ((uVar51 * 0x80 | uVar51 >> 0x19) ^
               (uVar51 * 0x200000 | uVar51 >> 0xb) ^ (uVar51 * 0x4000000 | uVar51 >> 6)) +
               uVar62 + uVar30 + ((uVar55 ^ uVar14) & uVar51 ^ uVar14) + -0x3e640e8c;
      uVar46 = uVar46 + iVar10;
      uVar62 = ((uVar37 | uVar36) & uVar35 | uVar37 & uVar36) +
               ((uVar37 * 0x400 | uVar37 >> 0x16) ^
               (uVar37 * 0x80000 | uVar37 >> 0xd) ^ (uVar37 * 0x40000000 | uVar37 >> 2)) + iVar10;
      uVar21 = uVar21 + uVar45 +
               (uVar28 >> 3 ^
               (uVar38 << 0xe | uVar28 >> 0x12) ^ ((uVar12 >> 0x18) << 0x19 | uVar28 >> 7)) +
               (uVar27 >> 10 ^ (uVar64 << 0xd | uVar27 >> 0x13) ^ (uVar64 << 0xf | uVar27 >> 0x11));
      iVar10 = ((uVar46 * 0x80 | uVar46 >> 0x19) ^
               (uVar46 * 0x200000 | uVar46 >> 0xb) ^ (uVar46 * 0x4000000 | uVar46 >> 6)) +
               uVar14 + uVar21 + ((uVar51 ^ uVar55) & uVar46 ^ uVar55) + -0x1b64963f;
      uVar35 = uVar35 + iVar10;
      uVar38 = ((uVar62 | uVar37) & uVar36 | uVar62 & uVar37) +
               ((uVar62 * 0x400 | uVar62 >> 0x16) ^
               (uVar62 * 0x80000 | uVar62 >> 0xd) ^ (uVar62 * 0x40000000 | uVar62 >> 2)) + iVar10;
      uVar15 = uVar28 + uVar23 +
               (uVar32 >> 3 ^
               (uVar39 << 0xe | uVar32 >> 0x12) ^ ((uVar15 >> 0x18) << 0x19 | uVar32 >> 7)) +
               (uVar30 >> 10 ^ (uVar9 << 0xd | uVar30 >> 0x13) ^ (uVar9 << 0xf | uVar30 >> 0x11));
      iVar10 = ((uVar35 * 0x80 | uVar35 >> 0x19) ^
               (uVar35 * 0x200000 | uVar35 >> 0xb) ^ (uVar35 * 0x4000000 | uVar35 >> 6)) +
               uVar55 + uVar15 + ((uVar46 ^ uVar51) & uVar35 ^ uVar51) + -0x1041b87a;
      uVar36 = uVar36 + iVar10;
      uVar55 = ((uVar38 | uVar62) & uVar37 | uVar38 & uVar62) +
               ((uVar38 * 0x400 | uVar38 >> 0x16) ^
               (uVar38 * 0x80000 | uVar38 >> 0xd) ^ (uVar38 * 0x40000000 | uVar38 >> 2)) + iVar10;
      uVar28 = uVar32 + uVar24 +
               (uVar47 >> 3 ^
               (uVar41 << 0xe | uVar47 >> 0x12) ^ ((uVar33 >> 0x18) << 0x19 | uVar47 >> 7)) +
               (uVar21 >> 10 ^
               (uVar21 * 0x2000 | uVar21 >> 0x13) ^ (uVar21 * 0x8000 | uVar21 >> 0x11));
      iVar10 = uVar51 + uVar28 + ((uVar35 ^ uVar46) & uVar36 ^ uVar46) +
               ((uVar36 * 0x80 | uVar36 >> 0x19) ^
               (uVar36 * 0x200000 | uVar36 >> 0xb) ^ (uVar36 * 0x4000000 | uVar36 >> 6)) + 0xfc19dc6
      ;
      uVar37 = uVar37 + iVar10;
      uVar14 = ((uVar55 | uVar38) & uVar62 | uVar55 & uVar38) +
               ((uVar55 * 0x400 | uVar55 >> 0x16) ^
               (uVar55 * 0x80000 | uVar55 >> 0xd) ^ (uVar55 * 0x40000000 | uVar55 >> 2)) + iVar10;
      uVar50 = uVar47 + uVar25 +
               (uVar18 >> 3 ^
               (uVar50 << 0xe | uVar18 >> 0x12) ^ ((uVar48 >> 0x18) << 0x19 | uVar18 >> 7)) +
               (uVar15 >> 10 ^
               (uVar15 * 0x2000 | uVar15 >> 0x13) ^ (uVar15 * 0x8000 | uVar15 >> 0x11));
      iVar10 = ((uVar37 * 0x80 | uVar37 >> 0x19) ^
               (uVar37 * 0x200000 | uVar37 >> 0xb) ^ (uVar37 * 0x4000000 | uVar37 >> 6)) +
               uVar46 + uVar50 + ((uVar36 ^ uVar35) & uVar37 ^ uVar35) + 0x240ca1cc;
      uVar62 = uVar62 + iVar10;
      uVar41 = ((uVar14 | uVar55) & uVar38 | uVar14 & uVar55) +
               ((uVar14 * 0x400 | uVar14 >> 0x16) ^
               (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar10;
      uVar52 = uVar18 + uVar26 +
               (uVar19 >> 3 ^
               (uVar52 << 0xe | uVar19 >> 0x12) ^ ((uVar13 >> 0x18) << 0x19 | uVar19 >> 7)) +
               (uVar28 >> 10 ^
               (uVar28 * 0x2000 | uVar28 >> 0x13) ^ (uVar28 * 0x8000 | uVar28 >> 0x11));
      iVar10 = ((uVar62 * 0x80 | uVar62 >> 0x19) ^
               (uVar62 * 0x200000 | uVar62 >> 0xb) ^ (uVar62 * 0x4000000 | uVar62 >> 6)) +
               uVar35 + uVar52 + ((uVar37 ^ uVar36) & uVar62 ^ uVar36) + 0x2de92c6f;
      uVar38 = uVar38 + iVar10;
      uVar13 = ((uVar41 | uVar14) & uVar55 | uVar41 & uVar14) +
               ((uVar41 * 0x400 | uVar41 >> 0x16) ^
               (uVar41 * 0x80000 | uVar41 >> 0xd) ^ (uVar41 * 0x40000000 | uVar41 >> 2)) + iVar10;
      uVar39 = uVar19 + uVar27 +
               (uVar20 >> 3 ^
               (uVar53 << 0xe | uVar20 >> 0x12) ^ ((uVar22 >> 0x18) << 0x19 | uVar20 >> 7)) +
               (uVar50 >> 10 ^
               (uVar50 * 0x2000 | uVar50 >> 0x13) ^ (uVar50 * 0x8000 | uVar50 >> 0x11));
      iVar10 = ((uVar38 * 0x80 | uVar38 >> 0x19) ^
               (uVar38 * 0x200000 | uVar38 >> 0xb) ^ (uVar38 * 0x4000000 | uVar38 >> 6)) +
               uVar36 + uVar39 + ((uVar62 ^ uVar37) & uVar38 ^ uVar37) + 0x4a7484aa;
      uVar55 = uVar55 + iVar10;
      uVar12 = ((uVar13 | uVar41) & uVar14 | uVar13 & uVar41) +
               ((uVar13 * 0x400 | uVar13 >> 0x16) ^
               (uVar13 * 0x80000 | uVar13 >> 0xd) ^ (uVar13 * 0x40000000 | uVar13 >> 2)) + iVar10;
      uVar53 = uVar20 + uVar30 +
               (uVar43 >> 3 ^
               (uVar54 << 0xe | uVar43 >> 0x12) ^ ((uVar42 >> 0x18) << 0x19 | uVar43 >> 7)) +
               (uVar52 >> 10 ^
               (uVar52 * 0x2000 | uVar52 >> 0x13) ^ (uVar52 * 0x8000 | uVar52 >> 0x11));
      iVar10 = ((uVar55 * 0x80 | uVar55 >> 0x19) ^
               (uVar55 * 0x200000 | uVar55 >> 0xb) ^ (uVar55 * 0x4000000 | uVar55 >> 6)) +
               uVar37 + uVar53 + ((uVar38 ^ uVar62) & uVar55 ^ uVar62) + 0x5cb0a9dc;
      uVar14 = uVar14 + iVar10;
      uVar48 = ((uVar12 | uVar13) & uVar41 | uVar12 & uVar13) +
               ((uVar12 * 0x400 | uVar12 >> 0x16) ^
               (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar10;
      uVar63 = (uVar44 >> 3 ^
               (uVar63 << 0xe | uVar44 >> 0x12) ^ ((uVar17 >> 0x18) << 0x19 | uVar44 >> 7)) + uVar43
               + uVar21 +
               (uVar39 >> 10 ^
               (uVar39 * 0x2000 | uVar39 >> 0x13) ^ (uVar39 * 0x8000 | uVar39 >> 0x11));
      iVar10 = ((uVar14 * 0x80 | uVar14 >> 0x19) ^
               (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6)) +
               uVar62 + uVar63 + ((uVar55 ^ uVar38) & uVar14 ^ uVar38) + 0x76f988da;
      uVar41 = uVar41 + iVar10;
      uVar42 = ((uVar48 | uVar12) & uVar13 | uVar48 & uVar12) +
               ((uVar48 * 0x400 | uVar48 >> 0x16) ^
               (uVar48 * 0x80000 | uVar48 >> 0xd) ^ (uVar48 * 0x40000000 | uVar48 >> 2)) + iVar10;
      uVar54 = (uVar45 >> 3 ^
               (uVar56 << 0xe | uVar45 >> 0x12) ^ ((uVar11 >> 0x18) << 0x19 | uVar45 >> 7)) + uVar44
               + uVar15 +
               (uVar53 >> 10 ^
               (uVar53 * 0x2000 | uVar53 >> 0x13) ^ (uVar53 * 0x8000 | uVar53 >> 0x11));
      iVar10 = ((uVar41 * 0x80 | uVar41 >> 0x19) ^
               (uVar41 * 0x200000 | uVar41 >> 0xb) ^ (uVar41 * 0x4000000 | uVar41 >> 6)) +
               uVar38 + uVar54 + ((uVar14 ^ uVar55) & uVar41 ^ uVar55) + -0x67c1aeae;
      uVar13 = uVar13 + iVar10;
      uVar33 = ((uVar42 | uVar48) & uVar12 | uVar42 & uVar48) +
               ((uVar42 * 0x400 | uVar42 >> 0x16) ^
               (uVar42 * 0x80000 | uVar42 >> 0xd) ^ (uVar42 * 0x40000000 | uVar42 >> 2)) + iVar10;
      uVar56 = (uVar23 >> 3 ^
               (uVar57 << 0xe | uVar23 >> 0x12) ^ ((uVar16 >> 0x18) << 0x19 | uVar23 >> 7)) + uVar45
               + uVar28 +
               (uVar63 >> 10 ^
               (uVar63 * 0x2000 | uVar63 >> 0x13) ^ (uVar63 * 0x8000 | uVar63 >> 0x11));
      iVar10 = ((uVar13 * 0x80 | uVar13 >> 0x19) ^
               (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6)) +
               uVar55 + uVar56 + ((uVar41 ^ uVar14) & uVar13 ^ uVar14) + -0x57ce3993;
      uVar12 = uVar12 + iVar10;
      uVar11 = ((uVar33 | uVar42) & uVar48 | uVar33 & uVar42) +
               ((uVar33 * 0x400 | uVar33 >> 0x16) ^
               (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar10;
      uVar17 = (uVar24 >> 3 ^
               (uVar58 << 0xe | uVar24 >> 0x12) ^ ((uVar29 >> 0x18) << 0x19 | uVar24 >> 7)) + uVar23
               + uVar50 +
               (uVar54 >> 10 ^
               (uVar54 * 0x2000 | uVar54 >> 0x13) ^ (uVar54 * 0x8000 | uVar54 >> 0x11));
      iVar10 = ((uVar12 * 0x80 | uVar12 >> 0x19) ^
               (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
               uVar14 + uVar17 + ((uVar13 ^ uVar41) & uVar12 ^ uVar41) + -0x4ffcd838;
      uVar48 = uVar48 + iVar10;
      uVar22 = ((uVar11 | uVar33) & uVar42 | uVar11 & uVar33) +
               ((uVar11 * 0x400 | uVar11 >> 0x16) ^
               (uVar11 * 0x80000 | uVar11 >> 0xd) ^ (uVar11 * 0x40000000 | uVar11 >> 2)) + iVar10;
      uVar14 = (uVar25 >> 3 ^
               (uVar59 << 0xe | uVar25 >> 0x12) ^ ((uVar34 >> 0x18) << 0x19 | uVar25 >> 7)) + uVar24
               + uVar52 +
               (uVar56 >> 10 ^
               (uVar56 * 0x2000 | uVar56 >> 0x13) ^ (uVar56 * 0x8000 | uVar56 >> 0x11));
      iVar10 = uVar41 + uVar14 + ((uVar12 ^ uVar13) & uVar48 ^ uVar13) +
               ((uVar48 * 0x80 | uVar48 >> 0x19) ^
               (uVar48 * 0x200000 | uVar48 >> 0xb) ^ (uVar48 * 0x4000000 | uVar48 >> 6)) +
               -0x40a68039;
      uVar42 = uVar42 + iVar10;
      uVar38 = ((uVar22 | uVar11) & uVar33 | uVar22 & uVar11) +
               ((uVar22 * 0x400 | uVar22 >> 0x16) ^
               (uVar22 * 0x80000 | uVar22 >> 0xd) ^ (uVar22 * 0x40000000 | uVar22 >> 2)) + iVar10;
      uVar36 = (uVar26 >> 3 ^
               (uVar60 << 0xe | uVar26 >> 0x12) ^ ((uVar40 >> 0x18) << 0x19 | uVar26 >> 7)) + uVar25
               + uVar39 +
               (uVar17 >> 10 ^
               (uVar17 * 0x2000 | uVar17 >> 0x13) ^ (uVar17 * 0x8000 | uVar17 >> 0x11));
      iVar10 = uVar13 + uVar36 + ((uVar48 ^ uVar12) & uVar42 ^ uVar12) +
               ((uVar42 * 0x80 | uVar42 >> 0x19) ^
               (uVar42 * 0x200000 | uVar42 >> 0xb) ^ (uVar42 * 0x4000000 | uVar42 >> 6)) +
               -0x391ff40d;
      uVar33 = uVar33 + iVar10;
      uVar41 = ((uVar38 | uVar22) & uVar11 | uVar38 & uVar22) +
               ((uVar38 * 0x400 | uVar38 >> 0x16) ^
               (uVar38 * 0x80000 | uVar38 >> 0xd) ^ (uVar38 * 0x40000000 | uVar38 >> 2)) + iVar10;
      uVar34 = (uVar27 >> 3 ^
               (uVar64 << 0xe | uVar27 >> 0x12) ^ ((uVar49 >> 0x18) << 0x19 | uVar27 >> 7)) + uVar26
               + uVar53 +
               (uVar14 >> 10 ^
               (uVar14 * 0x2000 | uVar14 >> 0x13) ^ (uVar14 * 0x8000 | uVar14 >> 0x11));
      iVar10 = uVar12 + uVar34 + ((uVar42 ^ uVar48) & uVar33 ^ uVar48) +
               ((uVar33 * 0x80 | uVar33 >> 0x19) ^
               (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6)) +
               -0x2a586eb9;
      uVar11 = uVar11 + iVar10;
      uVar16 = ((uVar41 | uVar38) & uVar22 | uVar41 & uVar38) +
               ((uVar41 * 0x400 | uVar41 >> 0x16) ^
               (uVar41 * 0x80000 | uVar41 >> 0xd) ^ (uVar41 * 0x40000000 | uVar41 >> 2)) + iVar10;
      uVar57 = (uVar30 >> 3 ^
               (uVar9 << 0xe | uVar30 >> 0x12) ^ ((uVar61 >> 0x18) << 0x19 | uVar30 >> 7)) + uVar27
               + uVar63 +
               (uVar36 >> 10 ^
               (uVar36 * 0x2000 | uVar36 >> 0x13) ^ (uVar36 * 0x8000 | uVar36 >> 0x11));
      iVar10 = ((uVar11 * 0x80 | uVar11 >> 0x19) ^
               (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6)) +
               uVar48 + uVar57 + ((uVar33 ^ uVar42) & uVar11 ^ uVar42) + 0x6ca6351;
      uVar22 = uVar22 + iVar10;
      uVar48 = ((uVar16 | uVar41) & uVar38 | uVar16 & uVar41) +
               ((uVar16 * 0x400 | uVar16 >> 0x16) ^
               (uVar16 * 0x80000 | uVar16 >> 0xd) ^ (uVar16 * 0x40000000 | uVar16 >> 2)) + iVar10;
      uVar13 = (uVar21 >> 3 ^
               (uVar21 * 0x4000 | uVar21 >> 0x12) ^ (uVar21 * 0x2000000 | uVar21 >> 7)) + uVar30 +
               uVar54 + (uVar34 >> 10 ^
                        (uVar34 * 0x2000 | uVar34 >> 0x13) ^ (uVar34 * 0x8000 | uVar34 >> 0x11));
      iVar10 = uVar42 + uVar13 + ((uVar11 ^ uVar33) & uVar22 ^ uVar33) +
               ((uVar22 * 0x80 | uVar22 >> 0x19) ^
               (uVar22 * 0x200000 | uVar22 >> 0xb) ^ (uVar22 * 0x4000000 | uVar22 >> 6)) +
               0x14292967;
      uVar38 = uVar38 + iVar10;
      uVar12 = ((uVar48 | uVar16) & uVar41 | uVar48 & uVar16) +
               ((uVar48 * 0x400 | uVar48 >> 0x16) ^
               (uVar48 * 0x80000 | uVar48 >> 0xd) ^ (uVar48 * 0x40000000 | uVar48 >> 2)) + iVar10;
      uVar58 = (uVar15 >> 3 ^
               (uVar15 * 0x4000 | uVar15 >> 0x12) ^ (uVar15 * 0x2000000 | uVar15 >> 7)) + uVar21 +
               uVar56 + (uVar57 >> 10 ^
                        (uVar57 * 0x2000 | uVar57 >> 0x13) ^ (uVar57 * 0x8000 | uVar57 >> 0x11));
      iVar10 = uVar33 + uVar58 + ((uVar22 ^ uVar11) & uVar38 ^ uVar11) +
               ((uVar38 * 0x80 | uVar38 >> 0x19) ^
               (uVar38 * 0x200000 | uVar38 >> 0xb) ^ (uVar38 * 0x4000000 | uVar38 >> 6)) +
               0x27b70a85;
      uVar41 = uVar41 + iVar10;
      uVar33 = ((uVar12 | uVar48) & uVar16 | uVar12 & uVar48) +
               ((uVar12 * 0x400 | uVar12 >> 0x16) ^
               (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar10;
      uVar59 = (uVar28 >> 3 ^
               (uVar28 * 0x4000 | uVar28 >> 0x12) ^ (uVar28 * 0x2000000 | uVar28 >> 7)) + uVar15 +
               uVar17 + (uVar13 >> 10 ^
                        (uVar13 * 0x2000 | uVar13 >> 0x13) ^ (uVar13 * 0x8000 | uVar13 >> 0x11));
      iVar10 = ((uVar41 * 0x80 | uVar41 >> 0x19) ^
               (uVar41 * 0x200000 | uVar41 >> 0xb) ^ (uVar41 * 0x4000000 | uVar41 >> 6)) +
               uVar11 + uVar59 + ((uVar38 ^ uVar22) & uVar41 ^ uVar22) + 0x2e1b2138;
      uVar16 = uVar16 + iVar10;
      uVar61 = ((uVar33 | uVar12) & uVar48 | uVar33 & uVar12) +
               ((uVar33 * 0x400 | uVar33 >> 0x16) ^
               (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar10;
      uVar40 = (uVar50 >> 3 ^
               (uVar50 * 0x4000 | uVar50 >> 0x12) ^ (uVar50 * 0x2000000 | uVar50 >> 7)) + uVar28 +
               uVar14 + (uVar58 >> 10 ^
                        (uVar58 * 0x2000 | uVar58 >> 0x13) ^ (uVar58 * 0x8000 | uVar58 >> 0x11));
      iVar10 = ((uVar16 * 0x80 | uVar16 >> 0x19) ^
               (uVar16 * 0x200000 | uVar16 >> 0xb) ^ (uVar16 * 0x4000000 | uVar16 >> 6)) +
               uVar22 + uVar40 + ((uVar41 ^ uVar38) & uVar16 ^ uVar38) + 0x4d2c6dfc;
      uVar48 = uVar48 + iVar10;
      uVar29 = ((uVar61 | uVar33) & uVar12 | uVar61 & uVar33) +
               ((uVar61 * 0x400 | uVar61 >> 0x16) ^
               (uVar61 * 0x80000 | uVar61 >> 0xd) ^ (uVar61 * 0x40000000 | uVar61 >> 2)) + iVar10;
      uVar22 = (uVar52 >> 3 ^
               (uVar52 * 0x4000 | uVar52 >> 0x12) ^ (uVar52 * 0x2000000 | uVar52 >> 7)) + uVar50 +
               uVar36 + (uVar59 >> 10 ^
                        (uVar59 * 0x2000 | uVar59 >> 0x13) ^ (uVar59 * 0x8000 | uVar59 >> 0x11));
      iVar10 = ((uVar48 * 0x80 | uVar48 >> 0x19) ^
               (uVar48 * 0x200000 | uVar48 >> 0xb) ^ (uVar48 * 0x4000000 | uVar48 >> 6)) +
               uVar38 + uVar22 + ((uVar16 ^ uVar41) & uVar48 ^ uVar41) + 0x53380d13;
      uVar12 = uVar12 + iVar10;
      uVar49 = ((uVar29 | uVar61) & uVar33 | uVar29 & uVar61) +
               ((uVar29 * 0x400 | uVar29 >> 0x16) ^
               (uVar29 * 0x80000 | uVar29 >> 0xd) ^ (uVar29 * 0x40000000 | uVar29 >> 2)) + iVar10;
      uVar42 = (uVar39 >> 3 ^
               (uVar39 * 0x4000 | uVar39 >> 0x12) ^ (uVar39 * 0x2000000 | uVar39 >> 7)) + uVar52 +
               uVar34 + (uVar40 >> 10 ^
                        (uVar40 * 0x2000 | uVar40 >> 0x13) ^ (uVar40 * 0x8000 | uVar40 >> 0x11));
      iVar10 = ((uVar12 * 0x80 | uVar12 >> 0x19) ^
               (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
               uVar41 + uVar42 + ((uVar48 ^ uVar16) & uVar12 ^ uVar16) + 0x650a7354;
      uVar33 = uVar33 + iVar10;
      uVar15 = ((uVar49 | uVar29) & uVar61 | uVar49 & uVar29) +
               ((uVar49 * 0x400 | uVar49 >> 0x16) ^
               (uVar49 * 0x80000 | uVar49 >> 0xd) ^ (uVar49 * 0x40000000 | uVar49 >> 2)) + iVar10;
      uVar60 = (uVar53 >> 3 ^
               (uVar53 * 0x4000 | uVar53 >> 0x12) ^ (uVar53 * 0x2000000 | uVar53 >> 7)) + uVar39 +
               uVar57 + (uVar22 >> 10 ^
                        (uVar22 * 0x2000 | uVar22 >> 0x13) ^ (uVar22 * 0x8000 | uVar22 >> 0x11));
      iVar10 = ((uVar33 * 0x80 | uVar33 >> 0x19) ^
               (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6)) +
               uVar16 + uVar60 + ((uVar12 ^ uVar48) & uVar33 ^ uVar48) + 0x766a0abb;
      uVar61 = uVar61 + iVar10;
      uVar52 = ((uVar15 | uVar49) & uVar29 | uVar15 & uVar49) +
               ((uVar15 * 0x400 | uVar15 >> 0x16) ^
               (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar10;
      uVar50 = (uVar63 >> 3 ^
               (uVar63 * 0x4000 | uVar63 >> 0x12) ^ (uVar63 * 0x2000000 | uVar63 >> 7)) + uVar53 +
               uVar13 + (uVar42 >> 10 ^
                        (uVar42 * 0x2000 | uVar42 >> 0x13) ^ (uVar42 * 0x8000 | uVar42 >> 0x11));
      iVar10 = ((uVar61 * 0x80 | uVar61 >> 0x19) ^
               (uVar61 * 0x200000 | uVar61 >> 0xb) ^ (uVar61 * 0x4000000 | uVar61 >> 6)) +
               uVar48 + uVar50 + ((uVar33 ^ uVar12) & uVar61 ^ uVar12) + -0x7e3d36d2;
      uVar29 = uVar29 + iVar10;
      uVar39 = ((uVar52 | uVar15) & uVar49 | uVar52 & uVar15) +
               ((uVar52 * 0x400 | uVar52 >> 0x16) ^
               (uVar52 * 0x80000 | uVar52 >> 0xd) ^ (uVar52 * 0x40000000 | uVar52 >> 2)) + iVar10;
      uVar63 = (uVar54 >> 3 ^
               (uVar54 * 0x4000 | uVar54 >> 0x12) ^ (uVar54 * 0x2000000 | uVar54 >> 7)) + uVar63 +
               uVar58 + (uVar60 >> 10 ^
                        (uVar60 * 0x2000 | uVar60 >> 0x13) ^ (uVar60 * 0x8000 | uVar60 >> 0x11));
      iVar10 = uVar12 + uVar63 + ((uVar61 ^ uVar33) & uVar29 ^ uVar33) +
               ((uVar29 * 0x80 | uVar29 >> 0x19) ^
               (uVar29 * 0x200000 | uVar29 >> 0xb) ^ (uVar29 * 0x4000000 | uVar29 >> 6)) +
               -0x6d8dd37b;
      uVar49 = uVar49 + iVar10;
      uVar12 = ((uVar39 | uVar52) & uVar15 | uVar39 & uVar52) +
               ((uVar39 * 0x400 | uVar39 >> 0x16) ^
               (uVar39 * 0x80000 | uVar39 >> 0xd) ^ (uVar39 * 0x40000000 | uVar39 >> 2)) + iVar10;
      uVar11 = (uVar56 >> 3 ^
               (uVar56 * 0x4000 | uVar56 >> 0x12) ^ (uVar56 * 0x2000000 | uVar56 >> 7)) + uVar54 +
               uVar59 + (uVar50 >> 10 ^
                        (uVar50 * 0x2000 | uVar50 >> 0x13) ^ (uVar50 * 0x8000 | uVar50 >> 0x11));
      iVar10 = ((uVar49 * 0x80 | uVar49 >> 0x19) ^
               (uVar49 * 0x200000 | uVar49 >> 0xb) ^ (uVar49 * 0x4000000 | uVar49 >> 6)) +
               uVar33 + uVar11 + ((uVar29 ^ uVar61) & uVar49 ^ uVar61) + -0x5d40175f;
      uVar15 = uVar15 + iVar10;
      uVar41 = ((uVar12 | uVar39) & uVar52 | uVar12 & uVar39) +
               ((uVar12 * 0x400 | uVar12 >> 0x16) ^
               (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar10;
      uVar16 = (uVar17 >> 3 ^
               (uVar17 * 0x4000 | uVar17 >> 0x12) ^ (uVar17 * 0x2000000 | uVar17 >> 7)) + uVar56 +
               uVar40 + (uVar63 >> 10 ^
                        (uVar63 * 0x2000 | uVar63 >> 0x13) ^ (uVar63 * 0x8000 | uVar63 >> 0x11));
      iVar10 = ((uVar15 * 0x80 | uVar15 >> 0x19) ^
               (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6)) +
               uVar61 + uVar16 + ((uVar49 ^ uVar29) & uVar15 ^ uVar29) + -0x57e599b5;
      uVar52 = uVar52 + iVar10;
      uVar33 = ((uVar41 | uVar12) & uVar39 | uVar41 & uVar12) +
               ((uVar41 * 0x400 | uVar41 >> 0x16) ^
               (uVar41 * 0x80000 | uVar41 >> 0xd) ^ (uVar41 * 0x40000000 | uVar41 >> 2)) + iVar10;
      uVar64 = (uVar14 >> 3 ^
               (uVar14 * 0x4000 | uVar14 >> 0x12) ^ (uVar14 * 0x2000000 | uVar14 >> 7)) + uVar17 +
               uVar22 + (uVar11 >> 10 ^
                        (uVar11 * 0x2000 | uVar11 >> 0x13) ^ (uVar11 * 0x8000 | uVar11 >> 0x11));
      iVar10 = ((uVar52 * 0x80 | uVar52 >> 0x19) ^
               (uVar52 * 0x200000 | uVar52 >> 0xb) ^ (uVar52 * 0x4000000 | uVar52 >> 6)) +
               uVar29 + uVar64 + ((uVar15 ^ uVar49) & uVar52 ^ uVar49) + -0x3db47490;
      uVar39 = uVar39 + iVar10;
      uVar54 = ((uVar33 | uVar41) & uVar12 | uVar33 & uVar41) +
               ((uVar33 * 0x400 | uVar33 >> 0x16) ^
               (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar10;
      uVar17 = (uVar36 >> 3 ^
               (uVar36 * 0x4000 | uVar36 >> 0x12) ^ (uVar36 * 0x2000000 | uVar36 >> 7)) + uVar14 +
               uVar42 + (uVar16 >> 10 ^
                        (uVar16 * 0x2000 | uVar16 >> 0x13) ^ (uVar16 * 0x8000 | uVar16 >> 0x11));
      iVar10 = ((uVar39 * 0x80 | uVar39 >> 0x19) ^
               (uVar39 * 0x200000 | uVar39 >> 0xb) ^ (uVar39 * 0x4000000 | uVar39 >> 6)) +
               uVar49 + uVar17 + ((uVar52 ^ uVar15) & uVar39 ^ uVar15) + -0x3893ae5d;
      uVar12 = uVar12 + iVar10;
      uVar29 = ((uVar54 | uVar33) & uVar41 | uVar54 & uVar33) +
               ((uVar54 * 0x400 | uVar54 >> 0x16) ^
               (uVar54 * 0x80000 | uVar54 >> 0xd) ^ (uVar54 * 0x40000000 | uVar54 >> 2)) + iVar10;
      uVar61 = (uVar34 >> 3 ^
               (uVar34 * 0x4000 | uVar34 >> 0x12) ^ (uVar34 * 0x2000000 | uVar34 >> 7)) + uVar36 +
               uVar60 + (uVar64 >> 10 ^
                        (uVar64 * 0x2000 | uVar64 >> 0x13) ^ (uVar64 * 0x8000 | uVar64 >> 0x11));
      iVar10 = ((uVar12 * 0x80 | uVar12 >> 0x19) ^
               (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
               uVar15 + uVar61 + ((uVar39 ^ uVar52) & uVar12 ^ uVar52) + -0x2e6d17e7;
      uVar41 = uVar41 + iVar10;
      uVar48 = ((uVar29 | uVar54) & uVar33 | uVar29 & uVar54) +
               ((uVar29 * 0x400 | uVar29 >> 0x16) ^
               (uVar29 * 0x80000 | uVar29 >> 0xd) ^ (uVar29 * 0x40000000 | uVar29 >> 2)) + iVar10;
      uVar38 = (uVar57 >> 3 ^
               (uVar57 * 0x4000 | uVar57 >> 0x12) ^ (uVar57 * 0x2000000 | uVar57 >> 7)) + uVar34 +
               uVar50 + (uVar17 >> 10 ^
                        (uVar17 * 0x2000 | uVar17 >> 0x13) ^ (uVar17 * 0x8000 | uVar17 >> 0x11));
      iVar10 = ((uVar41 * 0x80 | uVar41 >> 0x19) ^
               (uVar41 * 0x200000 | uVar41 >> 0xb) ^ (uVar41 * 0x4000000 | uVar41 >> 6)) +
               uVar52 + uVar38 + ((uVar12 ^ uVar39) & uVar41 ^ uVar39) + -0x2966f9dc;
      uVar33 = uVar33 + iVar10;
      uVar49 = ((uVar48 | uVar29) & uVar54 | uVar48 & uVar29) +
               ((uVar48 * 0x400 | uVar48 >> 0x16) ^
               (uVar48 * 0x80000 | uVar48 >> 0xd) ^ (uVar48 * 0x40000000 | uVar48 >> 2)) + iVar10;
      uVar15 = (uVar13 >> 3 ^
               (uVar13 * 0x4000 | uVar13 >> 0x12) ^ (uVar13 * 0x2000000 | uVar13 >> 7)) + uVar57 +
               uVar63 + (uVar61 >> 10 ^
                        (uVar61 * 0x2000 | uVar61 >> 0x13) ^ (uVar61 * 0x8000 | uVar61 >> 0x11));
      iVar10 = ((uVar33 * 0x80 | uVar33 >> 0x19) ^
               (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6)) +
               uVar39 + uVar15 + ((uVar41 ^ uVar12) & uVar33 ^ uVar12) + -0xbf1ca7b;
      uVar54 = uVar54 + iVar10;
      uVar53 = ((uVar49 | uVar48) & uVar29 | uVar49 & uVar48) +
               ((uVar49 * 0x400 | uVar49 >> 0x16) ^
               (uVar49 * 0x80000 | uVar49 >> 0xd) ^ (uVar49 * 0x40000000 | uVar49 >> 2)) + iVar10;
      uVar39 = (uVar58 >> 3 ^
               (uVar58 * 0x4000 | uVar58 >> 0x12) ^ (uVar58 * 0x2000000 | uVar58 >> 7)) + uVar13 +
               uVar11 + (uVar38 >> 10 ^
                        (uVar38 * 0x2000 | uVar38 >> 0x13) ^ (uVar38 * 0x8000 | uVar38 >> 0x11));
      iVar10 = ((uVar54 * 0x80 | uVar54 >> 0x19) ^
               (uVar54 * 0x200000 | uVar54 >> 0xb) ^ (uVar54 * 0x4000000 | uVar54 >> 6)) +
               uVar12 + uVar39 + ((uVar33 ^ uVar41) & uVar54 ^ uVar41) + 0x106aa070;
      uVar29 = uVar29 + iVar10;
      uVar12 = ((uVar53 | uVar49) & uVar48 | uVar53 & uVar49) +
               ((uVar53 * 0x400 | uVar53 >> 0x16) ^
               (uVar53 * 0x80000 | uVar53 >> 0xd) ^ (uVar53 * 0x40000000 | uVar53 >> 2)) + iVar10;
      uVar34 = (uVar59 >> 3 ^
               (uVar59 * 0x4000 | uVar59 >> 0x12) ^ (uVar59 * 0x2000000 | uVar59 >> 7)) + uVar58 +
               uVar16 + (uVar15 >> 10 ^
                        (uVar15 * 0x2000 | uVar15 >> 0x13) ^ (uVar15 * 0x8000 | uVar15 >> 0x11));
      iVar10 = ((uVar29 * 0x80 | uVar29 >> 0x19) ^
               (uVar29 * 0x200000 | uVar29 >> 0xb) ^ (uVar29 * 0x4000000 | uVar29 >> 6)) +
               uVar41 + uVar34 + ((uVar54 ^ uVar33) & uVar29 ^ uVar33) + 0x19a4c116;
      uVar48 = uVar48 + iVar10;
      uVar52 = ((uVar12 | uVar53) & uVar49 | uVar12 & uVar53) +
               ((uVar12 * 0x400 | uVar12 >> 0x16) ^
               (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar10;
      uVar41 = (uVar40 >> 3 ^
               (uVar40 * 0x4000 | uVar40 >> 0x12) ^ (uVar40 * 0x2000000 | uVar40 >> 7)) + uVar59 +
               uVar64 + (uVar39 >> 10 ^
                        (uVar39 * 0x2000 | uVar39 >> 0x13) ^ (uVar39 * 0x8000 | uVar39 >> 0x11));
      iVar10 = ((uVar48 * 0x80 | uVar48 >> 0x19) ^
               (uVar48 * 0x200000 | uVar48 >> 0xb) ^ (uVar48 * 0x4000000 | uVar48 >> 6)) +
               uVar33 + uVar41 + ((uVar29 ^ uVar54) & uVar48 ^ uVar54) + 0x1e376c08;
      uVar49 = uVar49 + iVar10;
      uVar33 = ((uVar52 | uVar12) & uVar53 | uVar52 & uVar12) +
               ((uVar52 * 0x400 | uVar52 >> 0x16) ^
               (uVar52 * 0x80000 | uVar52 >> 0xd) ^ (uVar52 * 0x40000000 | uVar52 >> 2)) + iVar10;
      uVar57 = (uVar22 >> 3 ^
               (uVar22 * 0x4000 | uVar22 >> 0x12) ^ (uVar22 * 0x2000000 | uVar22 >> 7)) + uVar40 +
               uVar17 + (uVar34 >> 10 ^
                        (uVar34 * 0x2000 | uVar34 >> 0x13) ^ (uVar34 * 0x8000 | uVar34 >> 0x11));
      iVar10 = ((uVar49 * 0x80 | uVar49 >> 0x19) ^
               (uVar49 * 0x200000 | uVar49 >> 0xb) ^ (uVar49 * 0x4000000 | uVar49 >> 6)) +
               uVar54 + uVar57 + ((uVar48 ^ uVar29) & uVar49 ^ uVar29) + 0x2748774c;
      uVar53 = uVar53 + iVar10;
      uVar54 = ((uVar33 | uVar52) & uVar12 | uVar33 & uVar52) +
               ((uVar33 * 0x400 | uVar33 >> 0x16) ^
               (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar10;
      uVar40 = (uVar42 >> 3 ^
               (uVar42 * 0x4000 | uVar42 >> 0x12) ^ (uVar42 * 0x2000000 | uVar42 >> 7)) + uVar22 +
               uVar61 + (uVar41 >> 10 ^
                        (uVar41 * 0x2000 | uVar41 >> 0x13) ^ (uVar41 * 0x8000 | uVar41 >> 0x11));
      iVar10 = ((uVar53 * 0x80 | uVar53 >> 0x19) ^
               (uVar53 * 0x200000 | uVar53 >> 0xb) ^ (uVar53 * 0x4000000 | uVar53 >> 6)) +
               uVar29 + uVar40 + ((uVar49 ^ uVar48) & uVar53 ^ uVar48) + 0x34b0bcb5;
      uVar12 = uVar12 + iVar10;
      uVar56 = ((uVar54 | uVar33) & uVar52 | uVar54 & uVar33) +
               ((uVar54 * 0x400 | uVar54 >> 0x16) ^
               (uVar54 * 0x80000 | uVar54 >> 0xd) ^ (uVar54 * 0x40000000 | uVar54 >> 2)) + iVar10;
      uVar22 = (uVar60 >> 3 ^
               (uVar60 * 0x4000 | uVar60 >> 0x12) ^ (uVar60 * 0x2000000 | uVar60 >> 7)) + uVar42 +
               uVar38 + (uVar57 >> 10 ^
                        (uVar57 * 0x2000 | uVar57 >> 0x13) ^ (uVar57 * 0x8000 | uVar57 >> 0x11));
      iVar10 = ((uVar12 * 0x80 | uVar12 >> 0x19) ^
               (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
               uVar48 + uVar22 + ((uVar53 ^ uVar49) & uVar12 ^ uVar49) + 0x391c0cb3;
      uVar52 = uVar52 + iVar10;
      uVar13 = ((uVar56 | uVar54) & uVar33 | uVar56 & uVar54) +
               ((uVar56 * 0x400 | uVar56 >> 0x16) ^
               (uVar56 * 0x80000 | uVar56 >> 0xd) ^ (uVar56 * 0x40000000 | uVar56 >> 2)) + iVar10;
      uVar29 = (uVar50 >> 3 ^
               (uVar50 * 0x4000 | uVar50 >> 0x12) ^ (uVar50 * 0x2000000 | uVar50 >> 7)) + uVar60 +
               uVar15 + (uVar40 >> 10 ^
                        (uVar40 * 0x2000 | uVar40 >> 0x13) ^ (uVar40 * 0x8000 | uVar40 >> 0x11));
      iVar10 = ((uVar52 * 0x80 | uVar52 >> 0x19) ^
               (uVar52 * 0x200000 | uVar52 >> 0xb) ^ (uVar52 * 0x4000000 | uVar52 >> 6)) +
               uVar49 + uVar29 + ((uVar12 ^ uVar53) & uVar52 ^ uVar53) + 0x4ed8aa4a;
      uVar33 = uVar33 + iVar10;
      uVar58 = ((uVar13 | uVar56) & uVar54 | uVar13 & uVar56) +
               ((uVar13 * 0x400 | uVar13 >> 0x16) ^
               (uVar13 * 0x80000 | uVar13 >> 0xd) ^ (uVar13 * 0x40000000 | uVar13 >> 2)) + iVar10;
      uVar49 = (uVar63 >> 3 ^
               (uVar63 * 0x4000 | uVar63 >> 0x12) ^ (uVar63 * 0x2000000 | uVar63 >> 7)) + uVar50 +
               uVar39 + (uVar22 >> 10 ^
                        (uVar22 * 0x2000 | uVar22 >> 0x13) ^ (uVar22 * 0x8000 | uVar22 >> 0x11));
      iVar10 = ((uVar33 * 0x80 | uVar33 >> 0x19) ^
               (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6)) +
               uVar53 + uVar49 + ((uVar52 ^ uVar12) & uVar33 ^ uVar12) + 0x5b9cca4f;
      uVar54 = uVar54 + iVar10;
      uVar50 = ((uVar58 | uVar13) & uVar56 | uVar58 & uVar13) +
               ((uVar58 * 0x400 | uVar58 >> 0x16) ^
               (uVar58 * 0x80000 | uVar58 >> 0xd) ^ (uVar58 * 0x40000000 | uVar58 >> 2)) + iVar10;
      uVar42 = (uVar11 >> 3 ^
               (uVar11 * 0x4000 | uVar11 >> 0x12) ^ (uVar11 * 0x2000000 | uVar11 >> 7)) + uVar63 +
               uVar34 + (uVar29 >> 10 ^
                        (uVar29 * 0x2000 | uVar29 >> 0x13) ^ (uVar29 * 0x8000 | uVar29 >> 0x11));
      iVar10 = ((uVar54 * 0x80 | uVar54 >> 0x19) ^
               (uVar54 * 0x200000 | uVar54 >> 0xb) ^ (uVar54 * 0x4000000 | uVar54 >> 6)) +
               uVar12 + uVar42 + ((uVar33 ^ uVar52) & uVar54 ^ uVar52) + 0x682e6ff3;
      uVar56 = uVar56 + iVar10;
      uVar12 = ((uVar50 | uVar58) & uVar13 | uVar50 & uVar58) +
               ((uVar50 * 0x400 | uVar50 >> 0x16) ^
               (uVar50 * 0x80000 | uVar50 >> 0xd) ^ (uVar50 * 0x40000000 | uVar50 >> 2)) + iVar10;
      uVar11 = (uVar16 >> 3 ^
               (uVar16 * 0x4000 | uVar16 >> 0x12) ^ (uVar16 * 0x2000000 | uVar16 >> 7)) + uVar11 +
               uVar41 + (uVar49 >> 10 ^
                        (uVar49 * 0x2000 | uVar49 >> 0x13) ^ (uVar49 * 0x8000 | uVar49 >> 0x11));
      iVar10 = ((uVar56 * 0x80 | uVar56 >> 0x19) ^
               (uVar56 * 0x200000 | uVar56 >> 0xb) ^ (uVar56 * 0x4000000 | uVar56 >> 6)) +
               uVar52 + uVar11 + ((uVar54 ^ uVar33) & uVar56 ^ uVar33) + 0x748f82ee;
      uVar13 = uVar13 + iVar10;
      uVar41 = ((uVar12 | uVar50) & uVar58 | uVar12 & uVar50) +
               ((uVar12 * 0x400 | uVar12 >> 0x16) ^
               (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar10;
      uVar16 = (uVar64 >> 3 ^
               (uVar64 * 0x4000 | uVar64 >> 0x12) ^ (uVar64 * 0x2000000 | uVar64 >> 7)) + uVar16 +
               uVar57 + (uVar42 >> 10 ^
                        (uVar42 * 0x2000 | uVar42 >> 0x13) ^ (uVar42 * 0x8000 | uVar42 >> 0x11));
      iVar10 = ((uVar13 * 0x80 | uVar13 >> 0x19) ^
               (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6)) +
               uVar33 + uVar16 + ((uVar56 ^ uVar54) & uVar13 ^ uVar54) + 0x78a5636f;
      uVar58 = uVar58 + iVar10;
      uVar52 = ((uVar41 | uVar12) & uVar50 | uVar41 & uVar12) +
               ((uVar41 * 0x400 | uVar41 >> 0x16) ^
               (uVar41 * 0x80000 | uVar41 >> 0xd) ^ (uVar41 * 0x40000000 | uVar41 >> 2)) + iVar10;
      uVar33 = (uVar17 >> 3 ^
               (uVar17 * 0x4000 | uVar17 >> 0x12) ^ (uVar17 * 0x2000000 | uVar17 >> 7)) + uVar64 +
               uVar40 + (uVar11 >> 10 ^
                        (uVar11 * 0x2000 | uVar11 >> 0x13) ^ (uVar11 * 0x8000 | uVar11 >> 0x11));
      iVar10 = ((uVar58 * 0x80 | uVar58 >> 0x19) ^
               (uVar58 * 0x200000 | uVar58 >> 0xb) ^ (uVar58 * 0x4000000 | uVar58 >> 6)) +
               uVar54 + uVar33 + ((uVar13 ^ uVar56) & uVar58 ^ uVar56) + -0x7b3787ec;
      uVar50 = uVar50 + iVar10;
      uVar48 = ((uVar52 | uVar41) & uVar12 | uVar52 & uVar41) +
               ((uVar52 * 0x400 | uVar52 >> 0x16) ^
               (uVar52 * 0x80000 | uVar52 >> 0xd) ^ (uVar52 * 0x40000000 | uVar52 >> 2)) + iVar10;
      uVar16 = (uVar61 >> 3 ^
               (uVar61 * 0x4000 | uVar61 >> 0x12) ^ (uVar61 * 0x2000000 | uVar61 >> 7)) + uVar17 +
               uVar22 + (uVar16 >> 10 ^
                        (uVar16 * 0x2000 | uVar16 >> 0x13) ^ (uVar16 * 0x8000 | uVar16 >> 0x11));
      iVar10 = ((uVar50 * 0x80 | uVar50 >> 0x19) ^
               (uVar50 * 0x200000 | uVar50 >> 0xb) ^ (uVar50 * 0x4000000 | uVar50 >> 6)) +
               uVar56 + uVar16 + ((uVar58 ^ uVar13) & uVar50 ^ uVar13) + -0x7338fdf8;
      uVar12 = uVar12 + iVar10;
      uVar22 = ((uVar48 | uVar52) & uVar41 | uVar48 & uVar52) +
               ((uVar48 * 0x400 | uVar48 >> 0x16) ^
               (uVar48 * 0x80000 | uVar48 >> 0xd) ^ (uVar48 * 0x40000000 | uVar48 >> 2)) + iVar10;
      uVar29 = (uVar38 >> 3 ^
               (uVar38 * 0x4000 | uVar38 >> 0x12) ^ (uVar38 * 0x2000000 | uVar38 >> 7)) + uVar61 +
               uVar29 + (uVar33 >> 10 ^
                        (uVar33 * 0x2000 | uVar33 >> 0x13) ^ (uVar33 * 0x8000 | uVar33 >> 0x11));
      iVar10 = ((uVar12 * 0x80 | uVar12 >> 0x19) ^
               (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
               uVar13 + uVar29 + ((uVar50 ^ uVar58) & uVar12 ^ uVar58) + -0x6f410006;
      uVar41 = uVar41 + iVar10;
      uVar17 = ((uVar22 | uVar48) & uVar52 | uVar22 & uVar48) +
               ((uVar22 * 0x400 | uVar22 >> 0x16) ^
               (uVar22 * 0x80000 | uVar22 >> 0xd) ^ (uVar22 * 0x40000000 | uVar22 >> 2)) + iVar10;
      uVar13 = (uVar15 >> 3 ^
               (uVar15 * 0x4000 | uVar15 >> 0x12) ^ (uVar15 * 0x2000000 | uVar15 >> 7)) + uVar38 +
               uVar49 + (uVar16 >> 10 ^
                        (uVar16 * 0x2000 | uVar16 >> 0x13) ^ (uVar16 * 0x8000 | uVar16 >> 0x11));
      iVar10 = ((uVar41 * 0x80 | uVar41 >> 0x19) ^
               (uVar41 * 0x200000 | uVar41 >> 0xb) ^ (uVar41 * 0x4000000 | uVar41 >> 6)) +
               uVar58 + uVar13 + ((uVar12 ^ uVar50) & uVar41 ^ uVar50) + -0x5baf9315;
      uVar52 = uVar52 + iVar10;
      uVar33 = ((uVar17 | uVar22) & uVar48 | uVar17 & uVar22) +
               ((uVar17 * 0x400 | uVar17 >> 0x16) ^
               (uVar17 * 0x80000 | uVar17 >> 0xd) ^ (uVar17 * 0x40000000 | uVar17 >> 2)) + iVar10;
      iVar10 = ((uVar52 * 0x80 | uVar52 >> 0x19) ^
               (uVar52 * 0x200000 | uVar52 >> 0xb) ^ (uVar52 * 0x4000000 | uVar52 >> 6)) +
               (uVar39 >> 3 ^
               (uVar39 * 0x4000 | uVar39 >> 0x12) ^ (uVar39 * 0x2000000 | uVar39 >> 7)) + uVar15 +
               uVar42 + (uVar29 >> 10 ^
                        (uVar29 * 0x2000 | uVar29 >> 0x13) ^ (uVar29 * 0x8000 | uVar29 >> 0x11)) +
               uVar50 + ((uVar41 ^ uVar12) & uVar52 ^ uVar12) + -0x41065c09;
      uVar48 = uVar48 + iVar10;
      uVar15 = ((uVar33 | uVar17) & uVar22 | uVar33 & uVar17) +
               ((uVar33 * 0x400 | uVar33 >> 0x16) ^
               (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar10;
      iVar10 = ((uVar48 * 0x80 | uVar48 >> 0x19) ^
               (uVar48 * 0x200000 | uVar48 >> 0xb) ^ (uVar48 * 0x4000000 | uVar48 >> 6)) +
               (uVar34 >> 3 ^
               (uVar34 * 0x4000 | uVar34 >> 0x12) ^ (uVar34 * 0x2000000 | uVar34 >> 7)) + uVar39 +
               uVar11 + (uVar13 >> 10 ^
                        (uVar13 * 0x2000 | uVar13 >> 0x13) ^ (uVar13 * 0x8000 | uVar13 >> 0x11)) +
               uVar12 + ((uVar52 ^ uVar41) & uVar48 ^ uVar41) + -0x398e870e;
      hash->s[0] = ((uVar15 | uVar33) & uVar17 | uVar15 & uVar33) + uVar1 +
                   ((uVar15 * 0x400 | uVar15 >> 0x16) ^
                   (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) +
                   iVar10;
      hash->s[1] = uVar15 + uVar2;
      hash->s[2] = uVar33 + uVar3;
      hash->s[3] = uVar17 + uVar4;
      hash->s[4] = uVar22 + uVar5 + iVar10;
      hash->s[5] = uVar48 + uVar6;
      hash->s[6] = uVar52 + uVar7;
      hash->s[7] = uVar41 + uVar8;
      __n = 0x40;
      uVar31 = 0;
    } while (0x3f < len);
  }
  if (len == 0) {
    return;
  }
  memcpy((void *)((long)hash->buf + local_b0),data,len);
  return;
}

Assistant:

static void secp256k1_sha256_write(secp256k1_sha256 *hash, const unsigned char *data, size_t len) {
    size_t bufsize = hash->bytes & 0x3F;
    hash->bytes += len;
    VERIFY_CHECK(hash->bytes >= len);
    while (len >= 64 - bufsize) {
        /* Fill the buffer, and process it. */
        size_t chunk_len = 64 - bufsize;
        memcpy(((unsigned char*)hash->buf) + bufsize, data, chunk_len);
        data += chunk_len;
        len -= chunk_len;
        secp256k1_sha256_transform(hash->s, hash->buf);
        bufsize = 0;
    }
    if (len) {
        /* Fill the buffer with what remains. */
        memcpy(((unsigned char*)hash->buf) + bufsize, data, len);
    }
}